

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

char * __thiscall CServer::GetMapName(CServer *this)

{
  int iVar1;
  CConfig *pCVar2;
  CServer *in_RDI;
  int i;
  char *pMapShortName;
  int local_14;
  char *local_10;
  
  pCVar2 = Config(in_RDI);
  local_10 = pCVar2->m_SvMap;
  local_14 = 0;
  do {
    Config(in_RDI);
    iVar1 = str_length((char *)0x10fe90);
    if (iVar1 + -1 <= local_14) {
      return local_10;
    }
    pCVar2 = Config(in_RDI);
    if (pCVar2->m_SvMap[local_14] == '/') {
LAB_0010fed5:
      pCVar2 = Config(in_RDI);
      local_10 = pCVar2->m_SvMap + (local_14 + 1);
    }
    else {
      pCVar2 = Config(in_RDI);
      if (pCVar2->m_SvMap[local_14] == '\\') goto LAB_0010fed5;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

const char *CServer::GetMapName()
{
	// get the name of the map without his path
	char *pMapShortName = &Config()->m_SvMap[0];
	for(int i = 0; i < str_length(Config()->m_SvMap)-1; i++)
	{
		if(Config()->m_SvMap[i] == '/' || Config()->m_SvMap[i] == '\\')
			pMapShortName = &Config()->m_SvMap[i+1];
	}
	return pMapShortName;
}